

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall QCss::Parser::test(Parser *this,TokenType t)

{
  int iVar1;
  
  iVar1 = this->index;
  if (((long)iVar1 < (this->symbols).d.size) && ((this->symbols).d.ptr[iVar1].token == t)) {
    this->index = iVar1 + 1;
    return true;
  }
  return false;
}

Assistant:

bool Parser::test(QCss::TokenType t)
{
    if (index >= symbols.size())
        return false;
    if (symbols.at(index).token == t) {
        ++index;
        return true;
    }
    return false;
}